

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImageIO.cpp
# Opt level: O1

Image * Imf_3_4::loadImage(string *fileName,Header *hdr)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  string *psVar4;
  Image *this;
  ostream *poVar5;
  ArgExc *pAVar6;
  bool tiled;
  bool multiPart;
  bool deep;
  stringstream _iex_throw_s;
  bool local_1ab;
  bool local_1aa;
  bool local_1a9;
  MultiPartInputFile local_1a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  ostream local_198 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_190;
  
  cVar2 = Imf_3_4::isOpenExrFile((fileName->_M_dataplus)._M_p,&local_1ab,&local_1a9,&local_1aa);
  if (cVar2 == '\0') {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"Cannot load image file ",0x17);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,".  The file is not an OpenEXR file.",0x23);
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,(stringstream *)local_1a8);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (local_1aa == true) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"Cannot load image file ",0x17);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_198,(fileName->_M_dataplus)._M_p,fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,".  Multi-part file loading is not supported.",0x2c);
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,(stringstream *)local_1a8);
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pcVar1 = (fileName->_M_dataplus)._M_p;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_1a8,pcVar1,iVar3,true);
  iVar3 = Imf_3_4::MultiPartInputFile::parts();
  if (0 < iVar3) {
    Imf_3_4::MultiPartInputFile::header((int)local_1a8);
    cVar2 = Imf_3_4::Header::hasType();
    if (cVar2 != '\0') {
      Imf_3_4::MultiPartInputFile::header((int)local_1a8);
      psVar4 = (string *)Imf_3_4::Header::type_abi_cxx11_();
      local_1ab = (bool)Imf_3_4::isTiled(psVar4);
      goto LAB_0011eba6;
    }
  }
  local_1ab = false;
LAB_0011eba6:
  if (local_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190);
  }
  if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
  }
  if (local_1a9 == true) {
    this = (Image *)operator_new(0x68);
    DeepImage::DeepImage((DeepImage *)this);
    if (local_1ab == true) {
      loadDeepTiledImage(fileName,hdr,(DeepImage *)this);
    }
    else {
      loadDeepScanLineImage(fileName,hdr,(DeepImage *)this);
    }
  }
  else {
    this = (Image *)operator_new(0x68);
    FlatImage::FlatImage((FlatImage *)this);
    if (local_1ab == true) {
      loadFlatTiledImage(fileName,hdr,(FlatImage *)this);
    }
    else {
      loadFlatScanLineImage(fileName,hdr,(FlatImage *)this);
    }
  }
  return this;
}

Assistant:

Image*
loadImage (const string& fileName, Header& hdr)
{
    bool tiled, deep, multiPart;

    if (!isOpenExrFile (fileName.c_str (), tiled, deep, multiPart))
    {
        THROW (
            ArgExc,
            "Cannot load image file " << fileName
                                      << ".  "
                                         "The file is not an OpenEXR file.");
    }

    if (multiPart)
    {
        THROW (
            ArgExc,
            "Cannot load image file "
                << fileName
                << ".  "
                   "Multi-part file loading is not supported.");
    }

    //XXX TODO: the tiled flag obtained above is unreliable;
    // open the file as a multi-part file and inspect the header.
    // Can the OpenEXR library be fixed?

    {
        MultiPartInputFile mpi (fileName.c_str ());

        tiled =
            (mpi.parts () > 0 && mpi.header (0).hasType () &&
             isTiled (mpi.header (0).type ()));
    }

    Image* img = 0;

    try
    {
        if (deep)
        {
            DeepImage* dimg = new DeepImage;
            img             = dimg;

            if (tiled)
                loadDeepTiledImage (fileName, hdr, *dimg);
            else
                loadDeepScanLineImage (fileName, hdr, *dimg);
        }
        else
        {
            FlatImage* fimg = new FlatImage;
            img             = fimg;

            if (tiled)
                loadFlatTiledImage (fileName, hdr, *fimg);
            else
                loadFlatScanLineImage (fileName, hdr, *fimg);
        }
    }
    catch (...)
    {
        delete img;
        throw;
    }

    return img;
}